

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

int io_file_read(lua_State *L,IOFileUD *iof,int start)

{
  MSize m;
  int iVar1;
  int iVar2;
  ulong uVar3;
  int in_EDX;
  undefined8 *in_RSI;
  long in_RDI;
  char *p;
  int nargs;
  int n;
  int ok;
  FILE *fp;
  long in_stack_ffffffffffffffa8;
  FILE *in_stack_ffffffffffffffb0;
  FILE *__stream;
  undefined7 in_stack_ffffffffffffffb8;
  bool bVar4;
  FILE *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  MSize MVar5;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  FILE *L_00;
  int local_4;
  
  __stream = (FILE *)*in_RSI;
  m = (int)(*(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x10) >> 3) - in_EDX;
  clearerr(__stream);
  if (m == 0) {
    iVar1 = io_file_readline((lua_State *)__stream,
                             (FILE *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),0
                            );
    local_4 = in_EDX + 1;
  }
  else {
    luaL_checkstack((lua_State *)in_stack_ffffffffffffffb0,
                    (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(char *)0x138a21);
    iVar1 = 1;
    MVar5 = m;
    local_4 = in_EDX;
    while( true ) {
      m = MVar5 - 1;
      bVar4 = MVar5 != 0 && iVar1 != 0;
      if (MVar5 == 0 || iVar1 == 0) break;
      iVar2 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
      if (*(int *)(*(long *)(in_RDI + 0x10) + 4 + (long)local_4 * 8) == -5) {
        uVar3 = (ulong)*(uint *)(*(long *)(in_RDI + 0x10) + (long)local_4 * 8);
        in_stack_ffffffffffffffc0 = (FILE *)(uVar3 + 0x10);
        if ((char)in_stack_ffffffffffffffc0->_flags == '*') {
          in_stack_ffffffffffffffc0 = (FILE *)(uVar3 + 0x11);
        }
        if ((char)in_stack_ffffffffffffffc0->_flags == 'n') {
          iVar1 = io_file_readnum((lua_State *)CONCAT17(bVar4,in_stack_ffffffffffffffb8),
                                  (FILE *)in_stack_ffffffffffffffb0);
        }
        else if ((in_stack_ffffffffffffffc0->_flags & 0xdf) == 0x4c) {
          iVar1 = io_file_readline((lua_State *)__stream,(FILE *)CONCAT44(iVar1,local_4),m);
        }
        else {
          if ((char)in_stack_ffffffffffffffc0->_flags != 'a') {
            lj_err_arg((lua_State *)in_stack_ffffffffffffffb0,iVar2,
                       (ErrMsg)in_stack_ffffffffffffffa8);
          }
          io_file_readall((lua_State *)CONCAT44(m,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc0);
        }
      }
      else {
        if (0xfffeffff < *(uint *)(*(long *)(in_RDI + 0x10) + 4 + (long)local_4 * 8)) {
          lj_err_arg((lua_State *)in_stack_ffffffffffffffb0,iVar2,(ErrMsg)in_stack_ffffffffffffffa8)
          ;
        }
        in_stack_ffffffffffffffa8 = in_RDI;
        L_00 = __stream;
        lj_lib_checkint((lua_State *)CONCAT17(bVar4,in_stack_ffffffffffffffb8),
                        (int)((ulong)__stream >> 0x20));
        iVar1 = io_file_readlen((lua_State *)L_00,(FILE *)CONCAT44(iVar1,local_4),m);
        in_stack_ffffffffffffffb0 = __stream;
        __stream = L_00;
      }
      local_4 = local_4 + 1;
      MVar5 = m;
    }
  }
  iVar2 = ferror(__stream);
  if (iVar2 == 0) {
    if (iVar1 == 0) {
      *(undefined4 *)(*(long *)(in_RDI + 0x18) + -4) = 0xffffffff;
    }
    local_4 = local_4 - in_EDX;
  }
  else {
    local_4 = luaL_fileresult((lua_State *)CONCAT44(iVar1,local_4),m,
                              (char *)in_stack_ffffffffffffffc0);
  }
  return local_4;
}

Assistant:

static int io_file_read(lua_State *L, IOFileUD *iof, int start)
{
  FILE *fp = iof->fp;
  int ok, n, nargs = (int)(L->top - L->base) - start;
  clearerr(fp);
  if (nargs == 0) {
    ok = io_file_readline(L, fp, 1);
    n = start+1;  /* Return 1 result. */
  } else {
    /* The results plus the buffers go on top of the args. */
    luaL_checkstack(L, nargs+LUA_MINSTACK, "too many arguments");
    ok = 1;
    for (n = start; nargs-- && ok; n++) {
      if (tvisstr(L->base+n)) {
	const char *p = strVdata(L->base+n);
	if (p[0] == '*') p++;
	if (p[0] == 'n')
	  ok = io_file_readnum(L, fp);
	else if ((p[0] & ~0x20) == 'L')
	  ok = io_file_readline(L, fp, (p[0] == 'l'));
	else if (p[0] == 'a')
	  io_file_readall(L, fp);
	else
	  lj_err_arg(L, n+1, LJ_ERR_INVFMT);
      } else if (tvisnumber(L->base+n)) {
	ok = io_file_readlen(L, fp, (MSize)lj_lib_checkint(L, n+1));
      } else {
	lj_err_arg(L, n+1, LJ_ERR_INVOPT);
      }
    }
  }
  if (ferror(fp))
    return luaL_fileresult(L, 0, NULL);
  if (!ok)
    setnilV(L->top-1);  /* Replace last result with nil. */
  return n - start;
}